

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.h
# Opt level: O3

bool __thiscall draco::PointCloudKdTreeDecoder::DecodeGeometryData(PointCloudKdTreeDecoder *this)

{
  long lVar1;
  ValueType VVar2;
  DecoderBuffer *pDVar3;
  
  pDVar3 = (this->super_PointCloudDecoder).buffer_;
  lVar1 = pDVar3->pos_ + 4;
  if (lVar1 <= pDVar3->data_size_) {
    VVar2 = *(ValueType *)(pDVar3->data_ + pDVar3->pos_);
    pDVar3->pos_ = lVar1;
    if (-1 < (int)VVar2) {
      ((this->super_PointCloudDecoder).point_cloud_)->num_points_ = VVar2;
      return true;
    }
  }
  return false;
}

Assistant:

DecoderBuffer *buffer() { return buffer_; }